

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariadicTable.h
# Opt level: O1

void __thiscall
VariadicTable<int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
::
print_each<4ul,std::tuple<int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>&,std::ostream,void>
          (VariadicTable<int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
           *this,long t,ostream *stream)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar3 = *(long *)(this + 0x70);
  if (lVar3 != *(long *)(this + 0x78)) {
    if (*(long *)(this + 0x78) - lVar3 != 0x1c) {
      __assert_fail("_precision.size() == std::tuple_size<typename std::remove_reference<TupleType>::type>::value"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lablnet[P]CS2124_filesystem/./src/Disk/../HashTable/../vendor/VariadicTable/VariadicTable.h"
                    ,0xd6,
                    "void VariadicTable<int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>>::print_each(TupleType &&, StreamType &, std::integral_constant<size_t, I>) [Ts = <int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>>, I = 4UL, TupleType = std::tuple<int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>> &, StreamType = std::basic_ostream<char>]"
                   );
    }
    *(long *)(stream + *(long *)(*(long *)stream + -0x18) + 8) = (long)*(int *)(lVar3 + 0x10);
  }
  lVar3 = *(long *)(this + 0x58);
  if (lVar3 != *(long *)(this + 0x60)) {
    if (*(long *)(this + 0x60) - lVar3 != 0x1c) {
      __assert_fail("_column_format.size() == std::tuple_size<typename std::remove_reference<TupleType>::type>::value"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lablnet[P]CS2124_filesystem/./src/Disk/../HashTable/../vendor/VariadicTable/VariadicTable.h"
                    ,0xdf,
                    "void VariadicTable<int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>>::print_each(TupleType &&, StreamType &, std::integral_constant<size_t, I>) [Ts = <int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>>, I = 4UL, TupleType = std::tuple<int, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>, std::basic_string<char>> &, StreamType = std::basic_ostream<char>]"
                   );
    }
    iVar1 = *(int *)(lVar3 + 0x10);
    if (iVar1 == 3) {
      lVar3 = *(long *)stream;
      lVar2 = *(long *)(lVar3 + -0x18);
      *(uint *)(stream + lVar2 + 0x18) = *(uint *)(stream + lVar2 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(stream + *(long *)(lVar3 + -0x18) + 8) = 2;
    }
    else {
      if (iVar1 == 2) {
        lVar3 = *(long *)(*(long *)stream + -0x18);
        uVar5 = *(uint *)(stream + lVar3 + 0x18) & 0xfffffefb | 4;
      }
      else {
        if (iVar1 != 1) goto LAB_00116d40;
        lVar3 = *(long *)(*(long *)stream + -0x18);
        uVar5 = *(uint *)(stream + lVar3 + 0x18) & 0xfffffefb | 0x100;
      }
      *(uint *)(stream + lVar3 + 0x18) = uVar5;
    }
  }
LAB_00116d40:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)*(uint *)(this + 0x20),' ');
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
  lVar3 = *(long *)poVar4;
  *(long *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x10) =
       (long)*(int *)(*(long *)(this + 0x40) + 0x10);
  lVar3 = *(long *)(lVar3 + -0x18);
  *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffff4f | 0x20;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)(t + 0x40),*(long *)(t + 0x48));
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_70,(ulong)*(uint *)(this + 0x20),' ');
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"|",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(this + 0x58) != *(long *)(this + 0x60)) {
    *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) =
         *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) & 0xfffffefb;
  }
  print_each<5ul,std::tuple<int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>&,std::ostream,void>
            (this,t,stream);
  return;
}

Assistant:

void print_each(TupleType && t, StreamType & stream, std::integral_constant<size_t, I>)
    {
        auto & val = std::get<I>(t);

        // Set the precision
        if (!_precision.empty())
        {
            assert(_precision.size() ==
                   std::tuple_size<typename std::remove_reference<TupleType>::type>::value);

            stream << std::setprecision(_precision[I]);
        }

        // Set the format
        if (!_column_format.empty())
        {
            assert(_column_format.size() ==
                   std::tuple_size<typename std::remove_reference<TupleType>::type>::value);

            if (_column_format[I] == VariadicTableColumnFormat::SCIENTIFIC)
                stream << std::scientific;

            if (_column_format[I] == VariadicTableColumnFormat::FIXED)
                stream << std::fixed;

            if (_column_format[I] == VariadicTableColumnFormat::PERCENT)
                stream << std::fixed << std::setprecision(2);
        }

        stream << std::string(_cell_padding, ' ') << std::setw(_column_sizes[I])
               << justify<decltype(val)>(0) << val << std::string(_cell_padding, ' ') << "|";

        // Unset the format
        if (!_column_format.empty())
        {
            // Because "stream << std::defaultfloat;" won't compile with old GCC or Clang
            stream.unsetf(std::ios_base::floatfield);
        }

        // Recursive call to print the next item
        print_each(std::forward<TupleType>(t), stream, std::integral_constant<size_t, I + 1>());
    }